

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O3

CBlockUndo *
GetUndoChecked(CBlockUndo *__return_storage_ptr__,BlockManager *blockman,CBlockIndex *blockindex)

{
  bool bVar1;
  UniValue *__return_storage_ptr___00;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock34;
  undefined1 local_50 [32];
  CBlockUndo *local_30;
  
  local_30 = *(CBlockUndo **)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->vtxundo).super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vtxundo).super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vtxundo).super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (blockindex->nHeight != 0) {
    local_50._0_8_ = &cs_main;
    local_50[8] = false;
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_50);
    CheckBlockDataAvailability(blockman,blockindex,true);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)local_50);
    bVar1 = node::BlockManager::UndoReadFromDisk(blockman,__return_storage_ptr__,blockindex);
    if (!bVar1) {
      __return_storage_ptr___00 = (UniValue *)__cxa_allocate_exception(0x58);
      local_50._0_8_ = local_50 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Can\'t read undo data from disk","");
      JSONRPCError(__return_storage_ptr___00,-1,(string *)local_50);
      if (*(CBlockUndo **)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(__return_storage_ptr___00,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_002cc5d2;
    }
  }
  if (*(CBlockUndo **)(in_FS_OFFSET + 0x28) == local_30) {
    return *(CBlockUndo **)(in_FS_OFFSET + 0x28);
  }
LAB_002cc5d2:
  __stack_chk_fail();
}

Assistant:

static CBlockUndo GetUndoChecked(BlockManager& blockman, const CBlockIndex& blockindex)
{
    CBlockUndo blockUndo;

    // The Genesis block does not have undo data
    if (blockindex.nHeight == 0) return blockUndo;

    {
        LOCK(cs_main);
        CheckBlockDataAvailability(blockman, blockindex, /*check_for_undo=*/true);
    }

    if (!blockman.UndoReadFromDisk(blockUndo, blockindex)) {
        throw JSONRPCError(RPC_MISC_ERROR, "Can't read undo data from disk");
    }

    return blockUndo;
}